

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_bool grapheme_break_extended(int lbc,int tbc,utf8proc_int32_t *state)

{
  int iVar1;
  int lbc_override;
  utf8proc_int32_t uVar2;
  utf8proc_bool uVar3;
  
  if ((state != (utf8proc_int32_t *)0x0) && (*state != 0)) {
    lbc = *state;
  }
  uVar3 = true;
  if (lbc != 0) {
    if (tbc == 3 && lbc == 2) goto LAB_001335dd;
    if ((2 < tbc - 2U) && (2 < lbc - 2U)) {
      if ((lbc == 9) || (lbc == 7)) {
        if (1 < tbc - 7U) goto LAB_00133669;
      }
      else if (((lbc != 6) || (4 < tbc - 6U)) || ((0x1bU >> (tbc - 6U & 0x1f) & 1) == 0)) {
LAB_00133669:
        uVar3 = false;
        if ((lbc == 0xd) || (tbc == 8 && (lbc & 0xfffffffdU) == 8)) goto LAB_001335df;
        if ((0xe < (uint)tbc) || ((0x5020U >> (tbc & 0x1fU) & 1) == 0)) {
          if (((tbc != 0x10) || (lbc != 0xf && lbc != 0x12)) && (1 < tbc - 0x11U || lbc != 0xe)) {
            uVar3 = tbc != 0xb || lbc != 0xb;
            goto LAB_001335df;
          }
        }
      }
LAB_001335dd:
      uVar3 = false;
    }
  }
LAB_001335df:
  if (state == (utf8proc_int32_t *)0x0) {
    return uVar3;
  }
  iVar1 = *state;
  uVar2 = 1;
  if (iVar1 != 0xb || tbc != 0xb) {
    if (iVar1 == 0xf) {
      uVar2 = 0xf;
      if (tbc == 5) goto LAB_001336f9;
    }
    else {
      uVar2 = 0xf;
      if (tbc == 5 && iVar1 == 0x12) goto LAB_001336f9;
    }
    uVar2 = tbc;
  }
LAB_001336f9:
  *state = uVar2;
  return uVar3;
}

Assistant:

static utf8proc_bool grapheme_break_extended(int lbc, int tbc, utf8proc_int32_t *state)
{
  int lbc_override = lbc;
  if (state && *state != UTF8PROC_BOUNDCLASS_START)
    lbc_override = *state;
  utf8proc_bool break_permitted = grapheme_break_simple(lbc_override, tbc);
  if (state) {
    // Special support for GB 12/13 made possible by GB999. After two RI
    // class codepoints we want to force a break. Do this by resetting the
    // second RI's bound class to UTF8PROC_BOUNDCLASS_OTHER, to force a break
    // after that character according to GB999 (unless of course such a break is
    // forbidden by a different rule such as GB9).
    if (*state == tbc && tbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR)
      *state = UTF8PROC_BOUNDCLASS_OTHER;
    // Special support for GB10. Fold any EXTEND codepoints into the previous
    // boundclass if we're dealing with an emoji base boundclass.
    else if ((*state == UTF8PROC_BOUNDCLASS_E_BASE      ||
              *state == UTF8PROC_BOUNDCLASS_E_BASE_GAZ) &&
             tbc == UTF8PROC_BOUNDCLASS_EXTEND)
      *state = UTF8PROC_BOUNDCLASS_E_BASE;
    else
      *state = tbc;
  }
  return break_permitted;
}